

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O2

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *graph,Dumper *dumper)

{
  unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
  *this_00;
  Node *node;
  mapped_type mVar1;
  ostream *poVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  size_t i;
  ulong uVar5;
  Graph *module;
  Dumper *local_68;
  deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
  *local_60;
  Taskflow *local_58;
  Graph *local_50;
  pointer local_48;
  pair<const_tf::Node_*,_const_tf::Graph_*> local_40;
  
  this_00 = &dumper->visited;
  local_60 = (deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
              *)&dumper->stack;
  local_68 = dumper;
  local_58 = this;
  local_50 = graph;
  for (local_48 = (graph->
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ).
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_48 !=
      (graph->
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ).
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; local_48 = local_48 + 1) {
    node = (local_48->_M_t).super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    if (*(__index_type *)
         ((long)&(node->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x38) == '\x06') {
      module = *(Graph **)
                &(node->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ;
      poVar2 = std::operator<<(os,'p');
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      std::operator<<(poVar2,"[shape=box3d, color=blue, label=\"");
      if ((node->_name)._M_string_length == 0) {
        poVar2 = std::operator<<(os,'p');
        std::ostream::_M_insert<void_const*>(poVar2);
      }
      else {
        std::operator<<(os,(string *)&node->_name);
      }
      iVar3 = std::
              _Hashtable<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&module);
      if (iVar3.super__Node_iterator_base<std::pair<const_tf::Graph_*const,_unsigned_long>,_false>.
          _M_cur == (__node_type *)0x0) {
        mVar1 = local_68->id;
        local_68->id = mVar1 + 1;
        pmVar4 = std::__detail::
                 _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,&module);
        *pmVar4 = mVar1;
        local_40.second = module;
        local_40.first = node;
        std::
        deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
        ::emplace_back<std::pair<tf::Node_const*,tf::Graph_const*>>(local_60,&local_40);
      }
      poVar2 = std::operator<<(os," [m");
      std::__detail::
      _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this_00,&module);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"]\"];\n");
      for (uVar5 = 0; graph = local_50, uVar5 < node->_num_successors; uVar5 = uVar5 + 1) {
        poVar2 = std::operator<<(os,'p');
        poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
        poVar2 = std::operator<<(poVar2,"->");
        poVar2 = std::operator<<(poVar2,'p');
        poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
        std::operator<<(poVar2,";\n");
      }
    }
    else {
      _dump(local_58,os,node,local_68);
    }
  }
  return;
}

Assistant:

inline void Taskflow::_dump(
  std::ostream& os, const Graph* graph, Dumper& dumper
) const {

  for(auto itr = graph->begin(); itr != graph->end(); ++itr) {

    Node* n = itr->get();

    // regular task
    if(n->_handle.index() != Node::MODULE) {
      _dump(os, n, dumper);
    }
    // module task
    else {
      //auto module = &(std::get_if<Node::Module>(&n->_handle)->module);
      auto module = &(std::get_if<Node::Module>(&n->_handle)->graph);

      os << 'p' << n << "[shape=box3d, color=blue, label=\"";
      if(n->_name.empty()) os << 'p' << n;
      else os << n->_name;

      if(dumper.visited.find(module) == dumper.visited.end()) {
        dumper.visited[module] = dumper.id++;
        dumper.stack.push({n, module});
      }

      os << " [m" << dumper.visited[module] << "]\"];\n";

      //for(const auto s : n->_successors) {
      for(size_t i=0; i<n->_num_successors; ++i) {
        os << 'p' << n << "->" << 'p' << n->_edges[i] << ";\n";
      }
    }
  }
}